

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

hugeint_t duckdb::BinaryNumericDivideHugeintWrapper::
          Operation<bool,duckdb::ModuloOperator,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                    (bool fun,hugeint_t left,hugeint_t right,ValidityMask *mask,idx_t idx)

{
  ulong *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar2;
  hugeint_t right_00;
  hugeint_t left_00;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  TemplatedValidityData<unsigned_long> *pTVar6;
  OutOfRangeException *this_00;
  uint64_t uVar7;
  int64_t iVar8;
  uint64_t uVar9;
  int64_t iVar10;
  hugeint_t hVar11;
  string local_98;
  hugeint_t local_70;
  string local_60;
  string local_40;
  
  iVar10 = right.upper;
  uVar7 = right.lower;
  iVar8 = left.upper;
  uVar9 = left.lower;
  local_98._M_dataplus._M_p = (pointer)0x0;
  local_98._M_string_length = 0x8000000000000000;
  bVar5 = hugeint_t::operator==((hugeint_t *)&stack0xffffffffffffff58,(hugeint_t *)&local_98);
  if (bVar5) {
    hugeint_t::hugeint_t(&local_70,-1);
    bVar5 = hugeint_t::operator==((hugeint_t *)&stack0xffffffffffffff48,&local_70);
    if (bVar5) {
      this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Overflow in division of %s / %s","");
      hugeint_t::ToString_abi_cxx11_(&local_40,(hugeint_t *)&stack0xffffffffffffff58);
      hugeint_t::ToString_abi_cxx11_(&local_60,(hugeint_t *)&stack0xffffffffffffff48);
      OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                (this_00,&local_98,&local_40,&local_60);
      __cxa_throw(this_00,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  hugeint_t::hugeint_t((hugeint_t *)&local_98,0);
  bVar5 = hugeint_t::operator==((hugeint_t *)&stack0xffffffffffffff48,(hugeint_t *)&local_98);
  if (bVar5) {
    if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
      local_70.lower = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_98,&local_70.lower);
      sVar4 = local_98._M_string_length;
      _Var3._M_p = local_98._M_dataplus._M_p;
      local_98._M_dataplus._M_p = (pointer)0x0;
      local_98._M_string_length = 0;
      this = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)_Var3._M_p;
      (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length);
      }
      pTVar6 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar6->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    bVar2 = (byte)idx & 0x3f;
    puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask + (idx >> 6);
    *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
    hVar11.upper = iVar8;
    hVar11.lower = uVar9;
  }
  else {
    left_00.upper = iVar8;
    left_00.lower = uVar9;
    right_00.upper = iVar10;
    right_00.lower = uVar7;
    hVar11 = ModuloOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                       (left_00,right_00);
  }
  return hVar11;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		if (left == NumericLimits<LEFT_TYPE>::Minimum() && right == -1) {
			throw OutOfRangeException("Overflow in division of %s / %s", left.ToString(), right.ToString());
		} else if (right == 0) {
			mask.SetInvalid(idx);
			return left;
		} else {
			return OP::template Operation<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(left, right);
		}
	}